

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O3

QList<int> * __thiscall
QVersionNumber::segments(QList<int> *__return_storage_ptr__,QVersionNumber *this)

{
  byte bVar1;
  QList<int> *pQVar2;
  Data *pDVar3;
  pointer piVar4;
  int iVar5;
  qsizetype i;
  ulong uVar6;
  
  bVar1 = (this->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    pQVar2 = (this->m_segments).field_0.pointer_segments;
    pDVar3 = (pQVar2->d).d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = (pQVar2->d).ptr;
    (__return_storage_ptr__->d).size = (pQVar2->d).size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<int>::resize(__return_storage_ptr__,(long)((char)bVar1 >> 1));
  uVar6 = 0;
  do {
    bVar1 = (this->m_segments).field_0.inline_segments[0];
    if ((bVar1 & 1) == 0) {
      pQVar2 = (this->m_segments).field_0.pointer_segments;
      if ((ulong)(pQVar2->d).size <= uVar6) {
        return __return_storage_ptr__;
      }
      iVar5 = (pQVar2->d).ptr[uVar6];
    }
    else {
      if ((long)((char)bVar1 >> 1) <= (long)uVar6) {
        return __return_storage_ptr__;
      }
      iVar5 = (int)(this->m_segments).field_0.inline_segments[uVar6 + 1];
    }
    piVar4 = QList<int>::data(__return_storage_ptr__);
    piVar4[uVar6] = iVar5;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

QList<int> QVersionNumber::segments() const
{
    if (m_segments.isUsingPointer())
        return *m_segments.pointer_segments;

    QList<int> result;
    result.resize(segmentCount());
    for (qsizetype i = 0; i < segmentCount(); ++i)
        result[i] = segmentAt(i);
    return result;
}